

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriParse.c
# Opt level: O0

wchar_t * uriParsePortW(UriParserStateW *state,wchar_t *first,wchar_t *afterLast)

{
  wchar_t *afterLast_local;
  wchar_t *first_local;
  UriParserStateW *state_local;
  
  state_local = (UriParserStateW *)afterLast;
  if ((first < afterLast) &&
     (state_local = (UriParserStateW *)first, (uint)(*first + L'\xffffffd0') < 10)) {
    state_local = (UriParserStateW *)uriParsePortW(state,first + 1,afterLast);
  }
  return (wchar_t *)state_local;
}

Assistant:

static const URI_CHAR * URI_FUNC(ParsePort)(URI_TYPE(ParserState) * state, const URI_CHAR * first, const URI_CHAR * afterLast) {
	if (first >= afterLast) {
		return afterLast;
	}

	switch (*first) {
	case URI_SET_DIGIT:
		return URI_FUNC(ParsePort)(state, first + 1, afterLast);

	default:
		return first;
	}
}